

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

void Abc_RRManClean(Abc_RRMan_t *p)

{
  Abc_RRMan_t *p_local;
  
  p->pNode = (Abc_Obj_t *)0x0;
  p->pFanin = (Abc_Obj_t *)0x0;
  p->pFanout = (Abc_Obj_t *)0x0;
  Vec_PtrClear(p->vFaninLeaves);
  Vec_PtrClear(p->vFanoutRoots);
  Vec_PtrClear(p->vLeaves);
  Vec_PtrClear(p->vCone);
  Vec_PtrClear(p->vRoots);
  if (p->pWnd != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pWnd);
  }
  if (p->pMiter != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pMiter);
  }
  p->pWnd = (Abc_Ntk_t *)0x0;
  p->pMiter = (Abc_Ntk_t *)0x0;
  return;
}

Assistant:

void Abc_RRManClean( Abc_RRMan_t * p )
{
    p->pNode   = NULL; 
    p->pFanin  = NULL; 
    p->pFanout = NULL; 
    Vec_PtrClear( p->vFaninLeaves  );  
    Vec_PtrClear( p->vFanoutRoots  );  
    Vec_PtrClear( p->vLeaves );  
    Vec_PtrClear( p->vCone );  
    Vec_PtrClear( p->vRoots );  
    if ( p->pWnd )   Abc_NtkDelete( p->pWnd );
    if ( p->pMiter ) Abc_NtkDelete( p->pMiter );
    p->pWnd   = NULL;
    p->pMiter = NULL;
}